

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jkGetF0.cc
# Opt level: O2

void sptk::snack::get_fast_cands
               (float *fdata,float *fdsdata,int ind,int step,int size,int dec,int start,int nlags,
               float *engref,int *maxloc,float *maxval,Cross *cp,float *peaks,int *locs,int *ncand,
               F0_params *par,int *dbsize,float **dbdata)

{
  ulong *puVar1;
  int iVar2;
  float *correl;
  float fVar3;
  uint uVar4;
  long lVar5;
  int iVar6;
  int iVar7;
  long lVar8;
  int iVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  
  fVar11 = par->lag_weight;
  iVar9 = nlags / dec + 1;
  iVar6 = 1;
  uVar4 = start / dec;
  if (start / dec < 2) {
    uVar4 = 1;
  }
  correl = cp->correl;
  crossf(fdsdata + (ind * step) / dec,size / dec + 1,uVar4,iVar9,engref,maxloc,maxval,correl,dbsize,
         dbdata);
  cp->maxloc = (short)*maxloc;
  cp->maxval = *maxval;
  fVar10 = *engref / (float)size;
  if (fVar10 < 0.0) {
    fVar10 = sqrtf(fVar10);
  }
  else {
    fVar10 = SQRT(fVar10);
  }
  cp->rms = fVar10;
  cp->firstlag = (short)uVar4;
  get_cand(cp,peaks,locs,iVar9,ncand,par->cand_thresh);
  iVar9 = *ncand;
  for (lVar5 = 0; iVar9 != (int)lVar5; lVar5 = lVar5 + 1) {
    lVar8 = (long)(int)(locs[lVar5] + ~uVar4);
    fVar10 = correl[lVar8 + 1];
    fVar13 = correl[lVar8] - correl[lVar8 + 2];
    fVar3 = fVar13 * 0.5 + (correl[lVar8 + 2] - fVar10);
    fVar12 = 0.0;
    if (1e-06 < ABS(fVar3)) {
      fVar12 = fVar13 / (fVar3 * 4.0);
      fVar10 = fVar10 - fVar3 * fVar12 * fVar12;
    }
    iVar7 = (int)(fVar12 * (float)dec + 0.5) + locs[lVar5] * dec;
    locs[lVar5] = iVar7;
    peaks[lVar5] = ((float)iVar7 * (-fVar11 / (float)nlags) + 1.0) * fVar10;
  }
  iVar9 = *ncand;
  uVar4 = par->n_cands;
  if ((int)uVar4 <= iVar9) {
    if ((int)uVar4 < 2) {
      uVar4 = 1;
    }
    for (iVar9 = 0; iVar9 != uVar4 - 1; iVar9 = iVar9 + 1) {
      iVar7 = *ncand;
      for (lVar5 = 0; iVar6 - iVar7 != (int)lVar5; lVar5 = lVar5 + -1) {
        fVar11 = peaks[(long)iVar7 + lVar5 + -1];
        if (peaks[(long)iVar7 + lVar5 + -2] < fVar11) {
          peaks[(long)iVar7 + lVar5 + -1] = peaks[(long)iVar7 + lVar5 + -2];
          peaks[(long)iVar7 + lVar5 + -2] = fVar11;
          puVar1 = (ulong *)(locs + (long)iVar7 + lVar5 + -2);
          *puVar1 = *puVar1 << 0x20 | *puVar1 >> 0x20;
        }
      }
      iVar6 = iVar6 + 1;
    }
    iVar9 = par->n_cands + -1;
    *ncand = iVar9;
  }
  crossfi(fdata + ind * step,size,start,nlags,7,engref,maxloc,maxval,correl,locs,iVar9,dbsize,dbdata
         );
  cp->maxloc = (short)*maxloc;
  cp->maxval = *maxval;
  fVar11 = *engref / (float)size;
  if (fVar11 < 0.0) {
    fVar11 = sqrtf(fVar11);
  }
  else {
    fVar11 = SQRT(fVar11);
  }
  cp->rms = fVar11;
  cp->firstlag = (short)start;
  get_cand(cp,peaks,locs,nlags,ncand,par->cand_thresh);
  iVar6 = par->n_cands;
  if (iVar6 <= *ncand) {
    iVar9 = 1;
    if (iVar6 < 2) {
      iVar6 = 1;
    }
    for (iVar7 = 0; iVar7 != iVar6 + -1; iVar7 = iVar7 + 1) {
      iVar2 = *ncand;
      for (lVar5 = 0; iVar9 - iVar2 != (int)lVar5; lVar5 = lVar5 + -1) {
        fVar11 = peaks[(long)iVar2 + lVar5 + -1];
        if (peaks[(long)iVar2 + lVar5 + -2] < fVar11) {
          peaks[(long)iVar2 + lVar5 + -1] = peaks[(long)iVar2 + lVar5 + -2];
          peaks[(long)iVar2 + lVar5 + -2] = fVar11;
          puVar1 = (ulong *)(locs + (long)iVar2 + lVar5 + -2);
          *puVar1 = *puVar1 << 0x20 | *puVar1 >> 0x20;
        }
      }
      iVar9 = iVar9 + 1;
    }
    *ncand = par->n_cands + -1;
  }
  return;
}

Assistant:

void get_fast_cands(float *fdata, float *fdsdata, int ind, int step, int size,
                    int dec, int start, int nlags, float *engref, int *maxloc,
                    float *maxval, Cross *cp, float *peaks, int *locs,
                    int *ncand, F0_params *par, int *dbsize, float **dbdata)
#endif
{
  int decind, decstart, decnlags, decsize, i, j, *lp;
  float *corp, xp, yp, lag_wt;
  register float *pe;

  lag_wt = par->lag_weight/nlags;
  decnlags = 1 + (nlags/dec);
  if((decstart = start/dec) < 1) decstart = 1;
  decind = (ind * step)/dec;
  decsize = 1 + (size/dec);
  corp = cp->correl;
    
  crossf(fdsdata + decind, decsize, decstart, decnlags, engref, maxloc,
#if 0
	maxval, corp);
#else
	maxval, corp, dbsize, dbdata);
#endif
  cp->maxloc = *maxloc;	/* location of maximum in correlation */
  cp->maxval = *maxval;	/* max. correlation value (found at maxloc) */
  cp->rms = (float) sqrt(*engref/size); /* rms in reference window */
  cp->firstlag = decstart;

  get_cand(cp,peaks,locs,decnlags,ncand,par->cand_thresh); /* return high peaks in xcorr */

  /* Interpolate to estimate peak locations and values at high sample rate. */
  for(i = *ncand, lp = locs, pe = peaks; i--; pe++, lp++) {
    j = *lp - decstart - 1;
    peak(&corp[j],&xp,&yp);
    *lp = (*lp * dec) + (int)(0.5+(xp*dec)); /* refined lag */
    *pe = yp*(1.0f - (lag_wt* *lp)); /* refined amplitude */
  }
  
  if(*ncand >= par->n_cands) {	/* need to prune candidates? */
    register int *loc, *locm, lt;
    register float smaxval, *pem;
    register int outer, inner, lim;
    for(outer=0, lim = par->n_cands-1; outer < lim; outer++)
      for(inner = *ncand - 1 - outer,
	  pe = peaks + (*ncand) -1, pem = pe-1,
	  loc = locs + (*ncand) - 1, locm = loc-1;
	  inner--;
	  pe--,pem--,loc--,locm--)
	if((smaxval = *pe) > *pem) {
	  *pe = *pem;
	  *pem = smaxval;
	  lt = *loc;
	  *loc = *locm;
	  *locm = lt;
	}
    *ncand = par->n_cands-1;  /* leave room for the unvoiced hypothesis */
  }
  crossfi(fdata + (ind * step), size, start, nlags, 7, engref, maxloc,
#if 0
	  maxval, corp, locs, *ncand);
#else
	  maxval, corp, locs, *ncand, dbsize, dbdata);
#endif

  cp->maxloc = *maxloc;	/* location of maximum in correlation */
  cp->maxval = *maxval;	/* max. correlation value (found at maxloc) */
  cp->rms = (float) sqrt(*engref/size); /* rms in reference window */
  cp->firstlag = start;
  get_cand(cp,peaks,locs,nlags,ncand,par->cand_thresh); /* return high peaks in xcorr */
    if(*ncand >= par->n_cands) {	/* need to prune candidates again? */
    register int *loc, *locm, lt;
    register float smaxval, *pe, *pem;
    register int outer, inner, lim;
    for(outer=0, lim = par->n_cands-1; outer < lim; outer++)
      for(inner = *ncand - 1 - outer,
	  pe = peaks + (*ncand) -1, pem = pe-1,
	  loc = locs + (*ncand) - 1, locm = loc-1;
	  inner--;
	  pe--,pem--,loc--,locm--)
	if((smaxval = *pe) > *pem) {
	  *pe = *pem;
	  *pem = smaxval;
	  lt = *loc;
	  *loc = *locm;
	  *locm = lt;
	}
    *ncand = par->n_cands - 1;  /* leave room for the unvoiced hypothesis */
  }
}